

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxMultiAssign::Emit(FxMultiAssign *this,VMFunctionBuilder *build)

{
  FxLocalVariableDeclaration *this_00;
  uint uVar1;
  FxLocalVariableDeclaration **ppFVar2;
  ExpEmit *pEVar3;
  ExpEmit EVar4;
  uint local_2c;
  uint i;
  VMFunctionBuilder *build_local;
  FxMultiAssign *this_local;
  undefined4 extraout_var;
  
  (*this->Right->_vptr_FxExpression[9])(this->Right,build);
  local_2c = 0;
  while( true ) {
    uVar1 = TArray<FxExpression_*,_FxExpression_*>::Size
                      (&(this->Base).super_TArray<FxExpression_*,_FxExpression_*>);
    if (uVar1 <= local_2c) break;
    ppFVar2 = TArray<FxLocalVariableDeclaration_*,_FxLocalVariableDeclaration_*>::operator[]
                        (&this->LocalVarContainer->LocalVars,(ulong)local_2c);
    this_00 = *ppFVar2;
    pEVar3 = TArray<ExpEmit,_ExpEmit>::operator[]
                       ((TArray<ExpEmit,_ExpEmit> *)&this->Right[2].ScriptPosition,(ulong)local_2c);
    FxLocalVariableDeclaration::SetReg(this_00,*pEVar3);
    local_2c = local_2c + 1;
  }
  TArray<ExpEmit,_ExpEmit>::Clear((TArray<ExpEmit,_ExpEmit> *)&this->Right[2].ScriptPosition);
  TArray<ExpEmit,_ExpEmit>::ShrinkToFit((TArray<ExpEmit,_ExpEmit> *)&this->Right[2].ScriptPosition);
  EVar4._0_4_ = (*(this->LocalVarContainer->super_FxSequence).super_FxExpression._vptr_FxExpression
                  [9])(this->LocalVarContainer,build);
  EVar4.Konst = (bool)(char)extraout_var;
  EVar4.Fixed = (bool)(char)((uint)extraout_var >> 8);
  EVar4.Final = (bool)(char)((uint)extraout_var >> 0x10);
  EVar4.Target = (bool)(char)((uint)extraout_var >> 0x18);
  return EVar4;
}

Assistant:

ExpEmit FxMultiAssign::Emit(VMFunctionBuilder *build)
{
	Right->Emit(build);
	for (unsigned i = 0; i < Base.Size(); i++)
	{
		LocalVarContainer->LocalVars[i]->SetReg(static_cast<FxVMFunctionCall *>(Right)->ReturnRegs[i]);
	}
	static_cast<FxVMFunctionCall *>(Right)->ReturnRegs.Clear();
	static_cast<FxVMFunctionCall *>(Right)->ReturnRegs.ShrinkToFit();
	return LocalVarContainer->Emit(build);
}